

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *ds,QTimeZone *tz)

{
  QTimeZonePrivate *pQVar1;
  bool bVar2;
  QDataStream *this;
  char *text;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QTimeZone::isValid(tz);
  if (bVar2) {
    pQVar1 = (tz->d).d;
    if (((ulong)pQVar1 & 3) == 0) {
      if (pQVar1 != (QTimeZonePrivate *)0x0) {
        (*pQVar1->_vptr_QTimeZonePrivate[0x18])(pQVar1,ds);
      }
      goto switchD_00316bb7_caseD_3;
    }
    switch((int)pQVar1 - 1U & 3) {
    case 0:
      operator<<::anon_class_1_0_00000001::operator()
                ((QString *)&QStack_38,(anon_class_1_0_00000001 *)"QTimeZone::LocalTime",text);
      operator<<(ds,(QString *)&QStack_38);
      break;
    case 1:
      operator<<::anon_class_1_0_00000001::operator()
                ((QString *)&QStack_38,(anon_class_1_0_00000001 *)"QTimeZone::UTC",text);
      operator<<(ds,(QString *)&QStack_38);
      break;
    case 2:
      operator<<::anon_class_1_0_00000001::operator()
                ((QString *)&QStack_38,(anon_class_1_0_00000001 *)"AheadOfUtcBy",text);
      this = operator<<(ds,(QString *)&QStack_38);
      QDataStream::operator<<(this,(qint32)((ulong)(tz->d).d >> 2));
      break;
    case 3:
      goto switchD_00316bb7_caseD_3;
    }
  }
  else {
    invalidId();
    operator<<(ds,(QString *)&QStack_38);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
switchD_00316bb7_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return ds;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &ds, const QTimeZone &tz)
{
    const auto toQString = [](const char *text) {
        return QString(QLatin1StringView(text));
    };
    if (tz.isValid())
        tz.d.serialize(ds, toQString);
    else
        ds << invalidId();
    return ds;
}